

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O2

int idaLsDQJac(sunrealtype t,sunrealtype c_j,N_Vector y,N_Vector yp,N_Vector r,SUNMatrix Jac,
              void *ida_mem,N_Vector tmp1,N_Vector tmp2,N_Vector tmp3)

{
  long lVar1;
  int iVar2;
  int error_code;
  char *msgfmt;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "Integrator memory is NULL.";
    error_code = -1;
    ida_mem = (IDAMem)0x0;
    iVar2 = 900;
  }
  else if (Jac == (SUNMatrix)0x0) {
    msgfmt = "Linear solver memory is NULL.";
    error_code = -2;
    iVar2 = 0x38c;
  }
  else {
    lVar1 = *(long *)(*(long *)((long)ida_mem + 0x1d0) + 8);
    if ((((*(long *)(lVar1 + 0x10) == 0) || (*(long *)(lVar1 + 0x58) == 0)) ||
        (*(long *)(lVar1 + 0x18) == 0)) ||
       (((*(long *)(lVar1 + 0x78) == 0 || (*(long *)(lVar1 + 0x28) == 0)) ||
        (*(long *)(lVar1 + 0x38) == 0)))) {
      msgfmt = "A required vector operation is not implemented.";
      error_code = -3;
      iVar2 = 0x399;
    }
    else {
      iVar2 = SUNMatGetID(Jac);
      if (iVar2 == 0) {
        iVar2 = idaLsDenseDQJac(t,c_j,y,yp,r,Jac,(IDAMem)ida_mem,tmp1);
        return iVar2;
      }
      iVar2 = SUNMatGetID(Jac);
      if (iVar2 == 3) {
        iVar2 = idaLsBandDQJac(t,c_j,y,yp,r,Jac,(IDAMem)ida_mem,tmp1,tmp2,tmp3);
        return iVar2;
      }
      msgfmt = "unrecognized matrix type for idaLsDQJac";
      error_code = -0x16;
      iVar2 = 0x3a9;
    }
  }
  IDAProcessError((IDAMem)ida_mem,error_code,iVar2,"idaLsDQJac",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_ls.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int idaLsDQJac(sunrealtype t, sunrealtype c_j, N_Vector y, N_Vector yp,
               N_Vector r, SUNMatrix Jac, void* ida_mem, N_Vector tmp1,
               N_Vector tmp2, N_Vector tmp3)
{
  int retval;
  IDAMem IDA_mem;
  IDA_mem = (IDAMem)ida_mem;

  /* access IDAMem structure */
  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDALS_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_LS_IDAMEM_NULL);
    return (IDALS_MEM_NULL);
  }

  /* verify that Jac is non-NULL */
  if (Jac == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_LMEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_LS_LMEM_NULL);
    return (IDALS_LMEM_NULL);
  }

  /* Verify that N_Vector supports required operations */
  if (IDA_mem->ida_tempv1->ops->nvcloneempty == NULL ||
      IDA_mem->ida_tempv1->ops->nvlinearsum == NULL ||
      IDA_mem->ida_tempv1->ops->nvdestroy == NULL ||
      IDA_mem->ida_tempv1->ops->nvscale == NULL ||
      IDA_mem->ida_tempv1->ops->nvgetarraypointer == NULL ||
      IDA_mem->ida_tempv1->ops->nvsetarraypointer == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_LS_BAD_NVECTOR);
    return (IDALS_ILL_INPUT);
  }

  /* Call the matrix-structure-specific DQ approximation routine */
  if (SUNMatGetID(Jac) == SUNMATRIX_DENSE)
  {
    retval = idaLsDenseDQJac(t, c_j, y, yp, r, Jac, IDA_mem, tmp1);
  }
  else if (SUNMatGetID(Jac) == SUNMATRIX_BAND)
  {
    retval = idaLsBandDQJac(t, c_j, y, yp, r, Jac, IDA_mem, tmp1, tmp2, tmp3);
  }
  else
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "unrecognized matrix type for idaLsDQJac");
    retval = IDA_ILL_INPUT;
  }
  return (retval);
}